

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP.cpp
# Opt level: O3

bool __thiscall SRUP_MSG::token(SRUP_MSG *this,uint8_t *t,uint16_t len)

{
  uint8_t *__dest;
  undefined6 in_register_00000012;
  
  if ((int)CONCAT62(in_register_00000012,len) != 0) {
    if (this->m_token != (uint8_t *)0x0) {
      operator_delete__(this->m_token);
    }
    __dest = (uint8_t *)operator_new__((ulong)len);
    this->m_token = __dest;
    memcpy(__dest,t,(ulong)len);
    this->m_token_len = len;
    return true;
  }
  return false;
}

Assistant:

bool SRUP_MSG::token(const uint8_t* t, uint16_t len)
{
    try
    {
        if (len < 1)
            return false;
        else
        {
            delete[] m_token;

            m_token = new uint8_t[len];
            std::memcpy(m_token, t, len);
            m_token_len = len;
        }
    }
    catch (...)
    {
        m_token = nullptr;
        return false;
    }

    return true;
}